

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.c
# Opt level: O3

bc_slist_t * bc_slist_sort(bc_slist_t *l,bc_sort_func_t cmp)

{
  _bc_slist_t *p_Var1;
  void *pvVar2;
  int iVar3;
  _bc_slist_t *p_Var4;
  bool bVar5;
  bc_slist_t *pbVar6;
  _bc_slist_t *p_Var7;
  
  if (l != (bc_slist_t *)0x0) {
    p_Var7 = (_bc_slist_t *)0x0;
    do {
      p_Var4 = l->next;
      if (p_Var4 == p_Var7) {
        return l;
      }
      bVar5 = false;
      pbVar6 = l;
      do {
        iVar3 = (*cmp)(pbVar6->data,p_Var4->data);
        p_Var1 = pbVar6->next;
        if (0 < iVar3) {
          pvVar2 = pbVar6->data;
          pbVar6->data = p_Var1->data;
          p_Var1->data = pvVar2;
          bVar5 = true;
        }
        p_Var4 = p_Var1->next;
        pbVar6 = p_Var1;
      } while (p_Var4 != p_Var7);
      p_Var7 = p_Var1;
    } while (bVar5);
  }
  return l;
}

Assistant:

bc_slist_t*
bc_slist_sort(bc_slist_t *l, bc_sort_func_t cmp)
{
    if (l == NULL) {
        return NULL;
    }

    bool swapped = false;
    bc_slist_t *lptr = NULL;
    bc_slist_t *rptr = NULL;

    do {
        swapped = false;
        lptr = l;

        while (lptr->next != rptr) {
            if (0 < cmp(lptr->data, lptr->next->data)) {
                void *tmp = lptr->data;
                lptr->data = lptr->next->data;
                lptr->next->data = tmp;
                swapped = true;
            }

            lptr = lptr->next;
        }

        rptr = lptr;
    } while(swapped);

    return l;
}